

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O2

Llb_Mnn_t * Llb_MnnStart(Aig_Man_t *pInit,Aig_Man_t *pAig,Gia_ParLlb_t *pPars)

{
  Llb_Mnn_t *p;
  DdManager *unique;
  DdManager *unique_00;
  DdManager *unique_01;
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  long lVar7;
  size_t __nmemb;
  int iVar8;
  
  p = (Llb_Mnn_t *)calloc(1,0xd0);
  p->pInit = pInit;
  p->pAig = pAig;
  p->pPars = pPars;
  unique = Cudd_Init(pAig->vObjs->nSize,0,0x100,0x40000,0);
  p->dd = unique;
  unique_00 = Cudd_Init(pAig->nRegs,0,0x100,0x40000,0);
  p->ddG = unique_00;
  unique_01 = Cudd_Init(pAig->nObjs[2],0,0x100,0x40000,0);
  p->ddR = unique_01;
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  Cudd_AutodynEnable(unique_00,CUDD_REORDER_SYMM_SIFT);
  Cudd_AutodynEnable(unique_01,CUDD_REORDER_SYMM_SIFT);
  pVVar1 = Vec_PtrAlloc(100);
  p->vRings = pVVar1;
  pVVar1 = Vec_PtrAlloc(pAig->nObjs[2]);
  p->vLeaves = pVVar1;
  for (iVar8 = 0; iVar8 < pAig->vCis->nSize; iVar8 = iVar8 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vCis,iVar8);
    Vec_PtrPush(pVVar1,pvVar2);
  }
  pVVar1 = Vec_PtrAlloc(pAig->nObjs[3]);
  p->vRoots = pVVar1;
  for (iVar8 = 0; iVar8 < pAig->nRegs; iVar8 = iVar8 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar8);
    Vec_PtrPush(pVVar1,pvVar2);
  }
  __nmemb = (size_t)pAig->vObjs->nSize;
  piVar3 = (int *)calloc(__nmemb,4);
  p->pOrderL = piVar3;
  piVar4 = (int *)calloc(__nmemb,4);
  p->pOrderL2 = piVar4;
  piVar5 = (int *)calloc(__nmemb,4);
  p->pOrderG = piVar5;
  piVar6 = (int *)calloc(__nmemb,4);
  p->pVars2Q = piVar6;
  for (iVar8 = 0; iVar8 < pAig->vCis->nSize; iVar8 = iVar8 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vCis,iVar8);
    piVar6[*(int *)((long)pvVar2 + 0x24)] = 1;
  }
  pVVar1 = pAig->vObjs;
  for (lVar7 = 0; lVar7 < pVVar1->nSize; lVar7 = lVar7 + 1) {
    iVar8 = (int)lVar7;
    piVar5[lVar7] = iVar8;
    piVar4[lVar7] = iVar8;
    piVar3[lVar7] = iVar8;
  }
  Llb_NonlinPrepareVarMap(p);
  return p;
}

Assistant:

Llb_Mnn_t * Llb_MnnStart( Aig_Man_t * pInit, Aig_Man_t * pAig, Gia_ParLlb_t *  pPars )
{
    Llb_Mnn_t * p;
    Aig_Obj_t * pObj;
    int i;
    p = ABC_CALLOC( Llb_Mnn_t, 1 );
    p->pInit = pInit;
    p->pAig  = pAig;
    p->pPars = pPars;
    p->dd    = Cudd_Init( Aig_ManObjNumMax(pAig), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    p->ddG   = Cudd_Init( Aig_ManRegNum(pAig),    0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    p->ddR   = Cudd_Init( Aig_ManCiNum(pAig),     0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( p->dd,  CUDD_REORDER_SYMM_SIFT );
    Cudd_AutodynEnable( p->ddG, CUDD_REORDER_SYMM_SIFT );
    Cudd_AutodynEnable( p->ddR, CUDD_REORDER_SYMM_SIFT );
    p->vRings = Vec_PtrAlloc( 100 );
    // create leaves
    p->vLeaves = Vec_PtrAlloc( Aig_ManCiNum(pAig) );
    Aig_ManForEachCi( pAig, pObj, i )
        Vec_PtrPush( p->vLeaves, pObj );
    // create roots
    p->vRoots = Vec_PtrAlloc( Aig_ManCoNum(pAig) );
    Saig_ManForEachLi( pAig, pObj, i )
        Vec_PtrPush( p->vRoots, pObj );
    // variables to quantify
    p->pOrderL = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    p->pOrderL2= ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    p->pOrderG = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    p->pVars2Q = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    Aig_ManForEachCi( pAig, pObj, i )
        p->pVars2Q[Aig_ObjId(pObj)] = 1;
    for ( i = 0; i < Aig_ManObjNumMax(pAig); i++ )
        p->pOrderL[i] = p->pOrderL2[i] = p->pOrderG[i] = i;
    Llb_NonlinPrepareVarMap( p ); 
    return p;
}